

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::TokenManager::GetKeyId
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aKeyId,CborMap *aToken)

{
  size_t __first;
  bool bVar1;
  Error *pEVar2;
  uchar *__last;
  allocator<unsigned_char> local_129;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  ErrorCode local_10c;
  Error local_108;
  ErrorCode local_dc;
  Error local_d8;
  ErrorCode local_ac;
  Error local_a8;
  size_t local_80;
  size_t keyIdLength;
  uint8_t *keyId;
  CborMap coseKey;
  undefined1 local_48 [8];
  CborMap cnf;
  CborMap *aToken_local;
  ByteArray *aKeyId_local;
  TokenManager *this_local;
  Error *error;
  
  cnf.super_CborValue.mCbor._7_1_ = 0;
  Error::Error(__return_storage_ptr__);
  CborMap::CborMap((CborMap *)local_48);
  CborMap::CborMap((CborMap *)&keyId);
  keyIdLength = 0;
  CborMap::Get(&local_a8,aToken,8,(CborMap *)local_48);
  pEVar2 = Error::operator=(__return_storage_ptr__,&local_a8);
  local_ac = kNone;
  bVar1 = commissioner::operator!=(pEVar2,&local_ac);
  Error::~Error(&local_a8);
  if (!bVar1) {
    CborMap::Get(&local_d8,(CborMap *)local_48,1,(CborMap *)&keyId);
    pEVar2 = Error::operator=(__return_storage_ptr__,&local_d8);
    local_dc = kNone;
    bVar1 = commissioner::operator!=(pEVar2,&local_dc);
    Error::~Error(&local_d8);
    if (!bVar1) {
      CborMap::Get(&local_108,(CborMap *)&keyId,2,(uint8_t **)&keyIdLength,&local_80);
      pEVar2 = Error::operator=(__return_storage_ptr__,&local_108);
      local_10c = kNone;
      bVar1 = commissioner::operator!=(pEVar2,&local_10c);
      Error::~Error(&local_108);
      __first = keyIdLength;
      if (!bVar1) {
        __last = (uchar *)(keyIdLength + local_80);
        std::allocator<unsigned_char>::allocator(&local_129);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_128,
                   (uchar *)__first,__last,&local_129);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(aKeyId,&local_128);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_128);
        std::allocator<unsigned_char>::~allocator(&local_129);
      }
    }
  }
  cnf.super_CborValue.mCbor._7_1_ = 1;
  CborMap::~CborMap((CborMap *)&keyId);
  CborMap::~CborMap((CborMap *)local_48);
  if ((cnf.super_CborValue.mCbor._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::GetKeyId(ByteArray &aKeyId, const CborMap &aToken) const
{
    Error          error;
    CborMap        cnf;
    CborMap        coseKey;
    const uint8_t *keyId = nullptr;
    size_t         keyIdLength;

    SuccessOrExit(error = aToken.Get(cwt::kCnf, cnf));
    SuccessOrExit(error = cnf.Get(cwt::kCoseKey, coseKey));
    SuccessOrExit(error = coseKey.Get(cose::kKeyId, keyId, keyIdLength));

    aKeyId = {keyId, keyId + keyIdLength};

exit:
    return error;
}